

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_4> * __thiscall
tcu::normalize<double,4>(Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *a)

{
  double dVar1;
  int i;
  long lVar2;
  double sqSum;
  double dVar3;
  
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar3 = dVar3 + *(double *)(this + lVar2 * 8) * *(double *)(this + lVar2 * 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (dVar3 < 0.0) {
    dVar3 = ::sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  lVar2 = 0;
  do {
    dVar1 = *(double *)(this + lVar2 * 8 + 8);
    __return_storage_ptr__->m_data[lVar2] = *(double *)(this + lVar2 * 8) * (1.0 / dVar3);
    (__return_storage_ptr__->m_data + lVar2)[1] = dVar1 * (1.0 / dVar3);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}